

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingReporter.cpp
# Opt level: O2

shared_ptr<ApprovalTests::BlockingReporter> __thiscall
ApprovalTests::BlockingReporter::onMachinesNotNamed(BlockingReporter *this,string *machineName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApprovalTests::BlockingReporter> sVar1;
  shared_ptr<ApprovalTests::MachineBlocker> machineBlocker;
  undefined1 local_50 [64];
  
  MachineBlocker::onMachinesNotNamed((MachineBlocker *)(local_50 + 0x10),machineName);
  ::std::make_shared<ApprovalTests::MachineBlocker,ApprovalTests::MachineBlocker>
            ((MachineBlocker *)local_50);
  MachineBlocker::~MachineBlocker((MachineBlocker *)(local_50 + 0x10));
  ::std::
  make_shared<ApprovalTests::BlockingReporter,std::shared_ptr<ApprovalTests::MachineBlocker>&>
            ((shared_ptr<ApprovalTests::MachineBlocker> *)this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<ApprovalTests::BlockingReporter>)
         sVar1.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockingReporter>
    BlockingReporter::onMachinesNotNamed(const std::string& machineName)
    {
        auto machineBlocker = std::make_shared<MachineBlocker>(
            MachineBlocker::onMachinesNotNamed(machineName));
        return std::make_shared<BlockingReporter>(machineBlocker);
    }